

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O2

void __thiscall
Centaurus::CompositeATN<unsigned_char>::build_closure_exclusive
          (CompositeATN<unsigned_char> *this,CATNClosure *closure,ATNPath *path,int color,
          ATNStateStack *stack,PriorityChain *priority)

{
  pointer pNVar1;
  pointer ppVar2;
  int iVar3;
  CATNNode<unsigned_char> *pCVar4;
  SimpleException *this_00;
  pointer pNVar5;
  int color_local;
  allocator local_a9;
  _Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
  *local_a8;
  CompositeATN<unsigned_char> *local_a0;
  ATNStateStack *local_98;
  PriorityChain *local_90;
  PriorityChain new_priority;
  undefined1 local_70 [32];
  ATNPath dest_path;
  
  color_local = color;
  local_a8 = (_Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
              *)closure;
  local_a0 = this;
  local_98 = stack;
  local_90 = priority;
  pCVar4 = get_node(this,path);
  pNVar5 = (pCVar4->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (pCVar4->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar5 == pNVar1) {
    ATNPath::parent_path(&dest_path,path);
    if ((int)(((long)dest_path.
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     .
                     super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)dest_path.
                    super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                    .
                    super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30) == 0) {
      build_wildcard_closure
                (local_a0,(CATNClosure *)local_a8,
                 &(path->
                  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ).
                  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].first,color,local_98,local_90);
    }
    else {
      build_closure_exclusive(local_a0,(CATNClosure *)local_a8,&dest_path,color,local_98,local_90);
    }
    std::
    vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
    ::~vector(&dest_path.
               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             );
  }
  else {
    for (; pNVar5 != pNVar1; pNVar5 = pNVar5 + 1) {
      if ((pNVar5->m_label).m_ranges.
          super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (pNVar5->m_label).m_ranges.
          super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ATNPath::replace_index(&dest_path,path,pNVar5->m_dest);
        pCVar4 = get_node(local_a0,&dest_path);
        ppVar2 = (path->
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ).
                 super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        PriorityChain::add(&new_priority,local_90,&ppVar2[-1].first,ppVar2[-1].second,pNVar5->m_tag)
        ;
        if ((pCVar4->m_submachine).m_id._M_string_length == 0) {
          std::
          _Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
          ::_M_emplace_unique<Centaurus::ATNPath&,int&,Centaurus::PriorityChain&>
                    (local_a8,&dest_path,&color_local,&new_priority);
          build_closure_exclusive
                    (local_a0,(CATNClosure *)local_a8,&dest_path,color_local,local_98,&new_priority)
          ;
        }
        else {
          iVar3 = ATNPath::count(&dest_path,
                                 &(path->
                                  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                                  ).
                                  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish[-1].first,
                                 pNVar5->m_dest);
          if (1 < iVar3) {
            this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string((string *)local_70,"Downward sentinel reached.",&local_a9);
            SimpleException::SimpleException(this_00,(string *)local_70);
            __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
          }
          ATNPath::add((ATNPath *)local_70,&dest_path,&pCVar4->m_submachine,0);
          build_closure_inclusive
                    (local_a0,(CATNClosure *)local_a8,(ATNPath *)local_70,color_local,local_98,
                     &new_priority);
          std::
          vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          ::~vector((vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     *)(local_70 + 8));
        }
        std::
        vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>::
        ~vector(&new_priority.
                 super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
               );
        std::
        vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
        ::~vector(&dest_path.
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 );
      }
    }
  }
  return;
}

Assistant:

void CompositeATN<TCHAR>::build_closure_exclusive(CATNClosure& closure, const ATNPath& path, int color, ATNStateStack& stack, const PriorityChain& priority) const
{
    const CATNNode<TCHAR>& node = get_node(path);

    //std::wcout << L"Exclusive " << path << L":" << color << std::endl;

    if (node.is_stop_node())
    {
        //std::wcout << L"Stop node " << path << std::endl;

        ATNPath parent = path.parent_path();

        if (parent.depth() == 0)
        {
            build_wildcard_closure(closure, path.leaf_id(), color, stack, priority);
        }
        else
        {
            build_closure_exclusive(closure, parent, color, stack, priority);
        }
    }
    else
    {
        //std::wcout << L"Intermediate node " << path << std::endl;

        for (const auto& tr : node.get_transitions())
        {
            if (tr.is_epsilon())
            {
                ATNPath dest_path = path.replace_index(tr.dest());

                const CATNNode<TCHAR>& dest_node = get_node(dest_path);

                PriorityChain new_priority = priority.add(path.leaf_id(), path.leaf_index(), tr.tag());

                if (dest_node.is_terminal())
                {
                    closure.emplace(dest_path, color, new_priority);

                    build_closure_exclusive(closure, dest_path, color, stack, new_priority);
                }
                else
                {
                    if (dest_path.count(path.leaf_id(), tr.dest()) >= 2)
                    {
                        throw SimpleException("Downward sentinel reached.");
                    }

                    build_closure_inclusive(closure, dest_path.add(dest_node.get_submachine(), 0), color, stack, new_priority);
                }
            }
        }
    }
}